

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O3

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitScopeEnd
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Expression *curr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Function *pFVar2;
  iterator __position;
  char *__function;
  Expression *expr;
  Expression *local_18;
  
  local_18 = curr;
  switch(this[4].func[-1].funcLocation.end) {
  case 0:
    handle_unreachable("unexpected end of function",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12f);
  case 1:
    expr = (Expression *)&local_18;
    break;
  case 2:
    if (curr->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_009f48f1;
    }
    goto LAB_009f487e;
  case 3:
    if (curr->_id != IfId) {
LAB_009f48c5:
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
LAB_009f48f1:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    expr = (Expression *)&curr[1].type;
    break;
  case 4:
    if (curr->_id != IfId) goto LAB_009f48c5;
LAB_009f487e:
    expr = curr + 2;
    break;
  case 5:
    handle_unreachable("try without catch",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12d);
  case 6:
    if (curr->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_009f48f1;
    }
    if (*(long *)(curr + 5) == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    expr = (Expression *)(curr[4].type.id + *(long *)(curr + 5) * 8 + -8);
    break;
  default:
    goto switchD_009f4832_default;
  }
  anon_unknown_18::Poppifier::patchScope((Poppifier *)this,(Expression **)expr);
switchD_009f4832_default:
  pFVar2 = this[4].func;
  __position._M_current =
       (Expression **)
       pFVar2[-1].effects.super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (__position._M_current == *(Expression ***)&pFVar2[-1].noFullInline) {
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    _M_realloc_insert<wasm::Expression*const&>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pFVar2[-1].effects,
               __position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    p_Var1 = &pFVar2[-1].effects.
              super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var1->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_pi->_M_use_count;
  }
  return;
}

Assistant:

void emitScopeEnd(Expression* curr) {
    static_cast<SubType*>(this)->emitScopeEnd(curr);
  }